

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkCovDeriveRegular(Cov_Man_t *p,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  int local_3c;
  Abc_Obj_t *pAStack_38;
  int i;
  Abc_Obj_t *pNodeNew;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Abc_Ntk_t *pNtk_local;
  Cov_Man_t *p_local;
  
  iVar1 = Abc_NtkIsStrash(pNtk);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                  ,0x1fc,"Abc_Ntk_t *Abc_NtkCovDeriveRegular(Cov_Man_t *, Abc_Ntk_t *)");
  }
  p_local = (Cov_Man_t *)Abc_NtkStartFrom(pNtk,ABC_NTK_LOGIC,ABC_FUNC_SOP);
  pAVar2 = Abc_AigConst1(pNtk);
  iVar1 = Abc_ObjFanoutNum(pAVar2);
  if (0 < iVar1) {
    pAVar2 = Abc_NtkCreateNodeConst1((Abc_Ntk_t *)p_local);
    pAVar3 = Abc_AigConst1(pNtk);
    (pAVar3->field_6).pCopy = pAVar2;
  }
  local_3c = 0;
  do {
    iVar1 = Abc_NtkCoNum(pNtk);
    if (iVar1 <= local_3c) {
      Abc_NtkLogicMakeSimpleCos((Abc_Ntk_t *)p_local,0);
      iVar1 = Abc_NtkCheck((Abc_Ntk_t *)p_local);
      if (iVar1 == 0) {
        printf("Abc_NtkCovDerive: The network check has failed.\n");
        Abc_NtkDelete((Abc_Ntk_t *)p_local);
        p_local = (Cov_Man_t *)0x0;
      }
      return (Abc_Ntk_t *)p_local;
    }
    pAVar2 = Abc_NtkCo(pNtk,local_3c);
    pAVar3 = Abc_ObjFanin0(pAVar2);
    pAStack_38 = Abc_NtkCovDerive_rec(p,(Abc_Ntk_t *)p_local,pAVar3);
    iVar1 = Abc_ObjFaninC0(pAVar2);
    if (iVar1 != 0) {
      if ((pAStack_38->field_5).pData != (void *)0x0) {
        pAVar3 = Abc_ObjFanin0(pAVar2);
        iVar1 = Abc_ObjFanoutNum(pAVar3);
        if (iVar1 == 1) {
          Abc_SopComplement((char *)(pAStack_38->field_5).pData);
          goto LAB_00b806fd;
        }
      }
      pAStack_38 = Abc_NtkCreateNodeInv((Abc_Ntk_t *)p_local,pAStack_38);
    }
LAB_00b806fd:
    Abc_ObjAddFanin((pAVar2->field_6).pCopy,pAStack_38);
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkCovDeriveRegular( Cov_Man_t * p, Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pNodeNew;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_LOGIC, ABC_FUNC_SOP );
    // reconstruct the network
    if ( Abc_ObjFanoutNum(Abc_AigConst1(pNtk)) > 0 )
        Abc_AigConst1(pNtk)->pCopy = Abc_NtkCreateNodeConst1(pNtkNew);
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pNodeNew = Abc_NtkCovDerive_rec( p, pNtkNew, Abc_ObjFanin0(pObj) );
        if ( Abc_ObjFaninC0(pObj) )
        {
            if ( pNodeNew->pData && Abc_ObjFanoutNum(Abc_ObjFanin0(pObj)) == 1 )
                Abc_SopComplement( (char *)pNodeNew->pData );
            else
                pNodeNew = Abc_NtkCreateNodeInv( pNtkNew, pNodeNew );
        }
        Abc_ObjAddFanin( pObj->pCopy, pNodeNew );
    }
    // add the COs
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkCovDerive: The network check has failed.\n" );
        Abc_NtkDelete( pNtkNew );
        return NULL;
    }
    return pNtkNew;
}